

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSym.c
# Opt level: O2

int Sim_ComputeTwoVarSymms(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  Sym_Man_t *p;
  abctime aVar6;
  abctime aVar7;
  int iVar8;
  ulong uVar9;
  
  aVar5 = Abc_Clock();
  srand(0xabc);
  p = Sym_ManStart(pNtk,fVerbose);
  uVar3 = Sim_UtilCountAllPairs(p->vSuppFun,p->nSimWords,p->vPairsTotal);
  p->nPairsRem = uVar3;
  p->nPairsTotal = uVar3;
  if (fVerbose != 0) {
    printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",(ulong)uVar3,
           (ulong)(uint)p->nPairsSymm,(ulong)(uint)p->nPairsNonSymm,(ulong)uVar3);
  }
  aVar6 = Abc_Clock();
  Sim_SymmsStructCompute(pNtk,p->vMatrSymms,p->vSuppFun);
  aVar7 = Abc_Clock();
  p->timeStruct = aVar7 - aVar6;
  Sim_UtilCountPairsAll(p);
  p->nPairsSymmStr = p->nPairsSymm;
  if (fVerbose != 0) {
    printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",(ulong)(uint)p->nPairsTotal
           ,(ulong)(uint)p->nPairsSymm,(ulong)(uint)p->nPairsNonSymm,(ulong)(uint)p->nPairsRem);
  }
  uVar3 = 1;
  iVar8 = 0;
  do {
    if (iVar8 == -1000) {
      iVar8 = -1;
      uVar9 = 1;
      do {
        iVar4 = Sim_SymmsGetPatternUsingSat(p,p->uPatRand);
        if (iVar4 == 0) {
          Sim_UtilCountPairsAll(p);
          if (fVerbose != 0) {
            printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",
                   (ulong)(uint)p->nPairsTotal,(ulong)(uint)p->nPairsSymm,
                   (ulong)(uint)p->nPairsNonSymm,(ulong)(uint)p->nPairsRem);
          }
          iVar8 = p->nPairsSymm;
          aVar6 = Abc_Clock();
          p->timeTotal = aVar6 - aVar5;
          Sym_ManStop(p);
          return iVar8;
        }
        Sim_SymmsSimulate(p,p->uPatRand,p->vMatrNonSymms);
        puVar2 = p->uPatRand;
        puVar1 = puVar2 + (p->iVar1 >> 5);
        *puVar1 = *puVar1 ^ 1 << ((byte)p->iVar1 & 0x1f);
        Sim_SymmsSimulate(p,puVar2,p->vMatrNonSymms);
        puVar2 = p->uPatRand;
        puVar1 = puVar2 + (p->iVar2 >> 5);
        *puVar1 = *puVar1 ^ 1 << ((byte)p->iVar2 & 0x1f);
        Sim_SymmsSimulate(p,puVar2,p->vMatrNonSymms);
        puVar2 = p->uPatRand;
        puVar1 = puVar2 + (p->iVar1 >> 5);
        *puVar1 = *puVar1 ^ 1 << ((byte)p->iVar1 & 0x1f);
        Sim_SymmsSimulate(p,puVar2,p->vMatrNonSymms);
        p->uPatRand[p->iVar2 >> 5] = p->uPatRand[p->iVar2 >> 5] ^ 1 << ((byte)p->iVar2 & 0x1f);
        if ((int)(uVar9 / 10) * 10 + iVar8 == 0) {
          iVar4 = Sim_UtilMatrsAreDisjoint(p);
          if (iVar4 == 0) {
            uVar3 = 0x75;
LAB_00407f6a:
            __assert_fail("Sim_UtilMatrsAreDisjoint( p )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSym.c"
                          ,uVar3,"int Sim_ComputeTwoVarSymms(Abc_Ntk_t *, int)");
          }
          Sim_UtilCountPairsAll(p);
          if ((fVerbose != 0) && ((int)(uVar9 / 0x32) * 0x32 + iVar8 == 0)) {
            printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",
                   (ulong)(uint)p->nPairsTotal,(ulong)(uint)p->nPairsSymm,
                   (ulong)(uint)p->nPairsNonSymm,(ulong)(uint)p->nPairsRem);
          }
        }
        uVar9 = (ulong)((int)uVar9 + 1);
        iVar8 = iVar8 + -1;
      } while( true );
    }
    Sim_UtilSetRandom(p->uPatRand,p->nSimWords);
    Sim_SymmsSimulate(p,p->uPatRand,p->vMatrNonSymms);
    if ((short)((short)((uVar3 & 0xffff) / 0x32) * -0x32 + 1) == (short)iVar8) {
      iVar4 = Sim_UtilMatrsAreDisjoint(p);
      if (iVar4 == 0) {
        uVar3 = 0x53;
        goto LAB_00407f6a;
      }
      Sim_UtilCountPairsAll(p);
      if ((fVerbose != 0) && ((short)((short)((uVar3 & 0xffff) / 500) * -500 + 1) == (short)iVar8))
      {
        printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",
               (ulong)(uint)p->nPairsTotal,(ulong)(uint)p->nPairsSymm,(ulong)(uint)p->nPairsNonSymm,
               (ulong)(uint)p->nPairsRem);
      }
    }
    iVar8 = iVar8 + -1;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes two variable symmetries.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Sim_ComputeTwoVarSymms( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sym_Man_t * p;
    Vec_Ptr_t * vResult;
    int Result;
    int i;
    abctime clk, clkTotal = Abc_Clock();

    srand( 0xABC );

    // start the simulation manager
    p = Sym_ManStart( pNtk, fVerbose );
    p->nPairsTotal = p->nPairsRem = Sim_UtilCountAllPairs( p->vSuppFun, p->nSimWords, p->vPairsTotal );
    if ( fVerbose )
        printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
               p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );

    // detect symmetries using circuit structure
clk = Abc_Clock();
    Sim_SymmsStructCompute( pNtk, p->vMatrSymms, p->vSuppFun );
p->timeStruct = Abc_Clock() - clk;

    Sim_UtilCountPairsAll( p );
    p->nPairsSymmStr = p->nPairsSymm;
    if ( fVerbose )
        printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
            p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );

    // detect symmetries using simulation
    for ( i = 1; i <= 1000; i++ )
    {
        // simulate this pattern
        Sim_UtilSetRandom( p->uPatRand, p->nSimWords );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        if ( i % 50 != 0 )
            continue;
        // check disjointness
        assert( Sim_UtilMatrsAreDisjoint( p ) );
        // count the number of pairs
        Sim_UtilCountPairsAll( p );
        if ( i % 500 != 0 )
            continue;
        if ( fVerbose )
            printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
                p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );
    }

    // detect symmetries using SAT
    for ( i = 1; Sim_SymmsGetPatternUsingSat( p, p->uPatRand ); i++ )
    {
        // simulate this pattern in four polarities
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar1 );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar2 );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar1 );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar2 );
/*
        // try the previuos pair
        Sim_XorBit( p->uPatRand, p->iVar1Old );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar2Old );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar1Old );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
*/
        if ( i % 10 != 0 )
            continue;
        // check disjointness
        assert( Sim_UtilMatrsAreDisjoint( p ) );
        // count the number of pairs
        Sim_UtilCountPairsAll( p );
        if ( i % 50 != 0 )
            continue;
        if ( fVerbose )
            printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
                p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );
    }

    // count the number of pairs
    Sim_UtilCountPairsAll( p );
    if ( fVerbose )
        printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
            p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );
//    Sim_UtilCountPairsAllPrint( p );

    Result = p->nPairsSymm;
    vResult = p->vMatrSymms;  
p->timeTotal = Abc_Clock() - clkTotal;
    //  p->vMatrSymms = NULL;
    Sym_ManStop( p );
    return Result;
}